

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

bool libcellml::areEqual(double a,double b)

{
  __type _Var1;
  bool in_DL;
  bool fullPrecision;
  string local_58;
  string local_38;
  double local_18;
  double b_local;
  double a_local;
  
  local_18 = b;
  b_local = a;
  convertToString_abi_cxx11_(&local_38,(libcellml *)0x1,a + 0.0,in_DL);
  convertToString_abi_cxx11_(&local_58,(libcellml *)0x1,local_18 + 0.0,fullPrecision);
  _Var1 = std::operator==(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

bool areEqual(double a, double b)
{
    // Note: we add 0.0 in case a is, for instance, equal to 0.0 and b is equal
    //       to -0.0.
    return convertToString(a + 0.0) == convertToString(b + 0.0);
}